

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O0

int FmsIOGetInt(FmsIOContext *ctx,char *path,FmsInt *value)

{
  ulonglong uVar1;
  int *piVar2;
  ulonglong *in_RDX;
  char *in_RSI;
  char *in_RDI;
  char v [512];
  char k [512];
  char acStackY_428 [512];
  char local_228 [520];
  ulonglong *local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar3;
  
  if (in_RDI == (char *)0x0) {
    iVar3 = 1;
  }
  else if (in_RSI == (char *)0x0) {
    iVar3 = 2;
  }
  else if (in_RDX == (ulonglong *)0x0) {
    iVar3 = 3;
  }
  else {
    local_20 = in_RDX;
    iVar3 = FmsIOReadKeyValue((FmsIOContext *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                              in_RSI);
    if (iVar3 == 0) {
      iVar3 = strcmp(local_228,in_RSI);
      if (iVar3 == 0) {
        uVar1 = strtoull(acStackY_428,(char **)0x0,10);
        *local_20 = uVar1;
        piVar2 = __errno_location();
        if (*piVar2 == 0x22) {
          iVar3 = 6;
        }
        else {
          piVar2 = __errno_location();
          if (*piVar2 == 0x16) {
            iVar3 = 7;
          }
          else {
            iVar3 = 0;
          }
        }
      }
      else {
        iVar3 = 5;
      }
    }
    else {
      iVar3 = 4;
    }
  }
  return iVar3;
}

Assistant:

static int
FmsIOGetInt(FmsIOContext *ctx, const char *path, FmsInt *value) {
  char k[FMS_BUFFER_SIZE], v[FMS_BUFFER_SIZE];
  if(!ctx) E_RETURN(1);
  if(!path) E_RETURN(2);
  if(!value) E_RETURN(3);

  // Error reading line
  if(FmsIOReadKeyValue(ctx, k, v))
    E_RETURN(4);

  // Path & key do not match
  if(strcmp(k, path))
    E_RETURN(5);

  *value = StrToFmsInt(v, NULL, 10);

  // Potential errors
  if (errno == ERANGE) { E_RETURN(6); }
  if (errno == EINVAL) { E_RETURN(7); }

  return 0;
}